

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_piz.c
# Opt level: O0

void wdec14(uint16_t l,uint16_t h,uint16_t *a,uint16_t *b)

{
  uint16_t uVar1;
  int16_t bs;
  int16_t as;
  int ai;
  int hi;
  int16_t hs;
  int16_t ls;
  uint16_t *b_local;
  uint16_t *a_local;
  uint16_t h_local;
  uint16_t l_local;
  
  uVar1 = l + (h & 1) + ((short)h >> 1);
  *a = uVar1;
  *b = uVar1 - h;
  return;
}

Assistant:

static inline void
wdec14 (uint16_t l, uint16_t h, uint16_t* a, uint16_t* b)
{
    int16_t ls = (int16_t) l;
    int16_t hs = (int16_t) h;

    int hi = hs;
    int ai = ls + (hi & 1) + (hi >> 1);

    int16_t as = (int16_t) ai;
    int16_t bs = (int16_t) (ai - hi);

    *a = (uint16_t) as;
    *b = (uint16_t) bs;
}